

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void * __thiscall
google::protobuf::Reflection::MutableRawImpl
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  OneofDescriptor *pOVar3;
  void *pvVar4;
  LogMessageFatal LStack_28;
  
  pOVar3 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar3 == (OneofDescriptor *)0x0) {
    pvVar4 = MutableRawNonOneofImpl(this,message,field);
    return pvVar4;
  }
  bVar1 = internal::ReflectionSchema::IsSplit(&this->schema_,field);
  if (!bVar1) {
    uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    return (void *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xb8a,"!schema_.IsSplit(field)");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

void* Reflection::MutableRawImpl(Message* message,
                                 const FieldDescriptor* field) const {
  if (ABSL_PREDICT_TRUE(!schema_.InRealOneof(field))) {
    return MutableRawNonOneofImpl(message, field);
  }

  // Oneof fields are not split.
  ABSL_DCHECK(!schema_.IsSplit(field));

  const uint32_t field_offset = schema_.GetFieldOffset(field);
  return GetPointerAtOffset<void>(message, field_offset);
}